

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  string local_80;
  string local_60;
  string local_40;
  
  String::operator_cast_to_string(&local_80,(String *)FLAGS_gtest_stream_result_to);
  if (local_80._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char)&local_80,0x3a);
    if (lVar1 == -1) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",local_80._M_dataplus._M_p);
      fflush(_stdout);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x50);
      std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_80);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_80);
      StreamingListener::StreamingListener(this_00,&local_40,&local_60);
      TestEventListeners::Append(&this->listeners_,(TestEventListener *)this_00);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}